

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_packbits.c
# Opt level: O0

int PackBitsEncodeChunk(TIFF *tif,uint8_t *bp,tmsize_t cc,uint16_t s)

{
  long lVar1;
  int iVar2;
  long local_40;
  tmsize_t chunk;
  tmsize_t rowsize;
  tmsize_t tStack_28;
  uint16_t s_local;
  tmsize_t cc_local;
  uint8_t *bp_local;
  TIFF *tif_local;
  
  lVar1 = *(long *)tif->tif_data;
  tStack_28 = cc;
  cc_local = (tmsize_t)bp;
  while( true ) {
    if (tStack_28 < 1) {
      return 1;
    }
    local_40 = lVar1;
    if (tStack_28 < lVar1) {
      local_40 = tStack_28;
    }
    iVar2 = PackBitsEncode(tif,(uint8_t *)cc_local,local_40,s);
    if (iVar2 < 0) break;
    cc_local = local_40 + cc_local;
    tStack_28 = tStack_28 - local_40;
  }
  return -1;
}

Assistant:

static int PackBitsEncodeChunk(TIFF *tif, uint8_t *bp, tmsize_t cc, uint16_t s)
{
    tmsize_t rowsize = *(tmsize_t *)tif->tif_data;

    while (cc > 0)
    {
        tmsize_t chunk = rowsize;

        if (cc < chunk)
            chunk = cc;

        if (PackBitsEncode(tif, bp, chunk, s) < 0)
            return (-1);
        bp += chunk;
        cc -= chunk;
    }
    return (1);
}